

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_map.cc
# Opt level: O0

int bloaty::sourcemap::ReadBase64VLQSegment(string_view *data,int32_t (*values) [5])

{
  bool bVar1;
  int32_t iVar2;
  const_reference pvVar3;
  long in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  string_view *in_stack_00000030;
  int i;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Arg *in_stack_ffffffffffffff80;
  Arg *in_stack_ffffffffffffff98;
  string_view in_stack_ffffffffffffffa0;
  undefined4 local_14;
  
  local_14 = 0;
  while( true ) {
    if (4 < local_14) {
      Throw((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
    iVar2 = ReadBase64VLQ(in_stack_00000030);
    *(int32_t *)(in_RSI + (long)local_14 * 4) = iVar2;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(in_RDI);
    if (bVar1) break;
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front(in_RDI);
    bVar1 = IsBase64Digit(*pvVar3);
    if (!bVar1) break;
    local_14 = local_14 + 1;
  }
  if (((local_14 != 0) && (local_14 != 3)) && (local_14 != 4)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&in_stack_ffffffffffffff80->piece_,
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    absl::substitute_internal::Arg::Arg(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    absl::Substitute_abi_cxx11_(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::__cxx11::string::c_str();
    Throw((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  return local_14 + 1;
}

Assistant:

static int ReadBase64VLQSegment(std::string_view* data, int32_t (&values)[5]) {
  for (int i = 0; i < 5; i++) {
    values[i] = ReadBase64VLQ(data);
    if (data->empty() || !IsBase64Digit(data->front())) {
      if (i != 0 && i != 3 && i != 4) {
        THROWF("Invalid source map VLQ segment length $0", i + 1);
      }
      return i + 1;
    }
  }
  THROW("Unterminated Base64VLQ segment");
}